

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

DeviceInfo * __thiscall
RtApi::getDeviceInfo(DeviceInfo *__return_storage_ptr__,RtApi *this,uint deviceId)

{
  pointer pDVar1;
  uint uVar2;
  ulong uVar3;
  pointer pDVar4;
  
  pDVar4 = (this->deviceList_).
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (this->deviceList_).
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar1 == pDVar4) {
    (*this->_vptr_RtApi[0xb])(this);
    pDVar4 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar1 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if ((ulong)(((long)pDVar1 - (long)pDVar4) / 0x60) <= uVar3) {
      std::__cxx11::string::assign((char *)&this->errorText_);
      error(this,RTAUDIO_INVALID_PARAMETER);
      *(undefined8 *)__return_storage_ptr__ = 0;
      (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->name)._M_string_length = 0;
      (__return_storage_ptr__->name).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = 0;
      __return_storage_ptr__->outputChannels = 0;
      __return_storage_ptr__->inputChannels = 0;
      __return_storage_ptr__->duplexChannels = 0;
      __return_storage_ptr__->isDefaultOutput = false;
      __return_storage_ptr__->isDefaultInput = false;
      *(undefined2 *)&__return_storage_ptr__->field_0x36 = 0;
      (__return_storage_ptr__->name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->name).field_2;
      (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->outputChannels = 0;
      __return_storage_ptr__->inputChannels = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->inputChannels + 2) = 0;
      (__return_storage_ptr__->sampleRates).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->sampleRates).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->sampleRates).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->currentSampleRate = 0;
      __return_storage_ptr__->preferredSampleRate = 0;
      __return_storage_ptr__->nativeFormats = 0;
      return __return_storage_ptr__;
    }
    uVar2 = uVar2 + 1;
  } while (pDVar4[uVar3].ID != deviceId);
  RtAudio::DeviceInfo::DeviceInfo(__return_storage_ptr__,pDVar4 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

RtAudio::DeviceInfo RtApi :: getDeviceInfo( unsigned int deviceId )
{
  if ( deviceList_.size() == 0 ) probeDevices();
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId )
      return deviceList_[m];
  }

  errorText_ = "RtApi::getDeviceInfo: deviceId argument not found.";
  error( RTAUDIO_INVALID_PARAMETER );
  return RtAudio::DeviceInfo();
}